

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char> __thiscall
fmt::v7::detail::float_writer<char>::prettify<fmt::v7::detail::buffer_appender<char>>
          (float_writer<char> *this,buffer_appender<char> it)

{
  bool bVar1;
  int iVar2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar3;
  buffer_appender<char> bVar4;
  __type _Var5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  char local_39 [3];
  char local_36 [3];
  char local_33 [3];
  
  uVar12 = this->exp_ + this->num_digits_;
  if ((this->specs_).field_0x4 == '\x01') {
    local_39[0] = *this->digits_;
    buffer<char>::push_back
              ((buffer<char> *)
               it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,local_39);
    iVar13 = this->num_digits_;
    iVar8 = (this->specs_).precision - iVar13;
    if ((1 < iVar13) || (((this->specs_).field_0x6 & 0x10) != 0)) {
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                 &this->decimal_point_);
      iVar13 = this->num_digits_;
    }
    bVar3.container =
         (buffer<char> *)
         std::__copy_move<false,false,std::random_access_iterator_tag>::
         __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                   (this->digits_ + 1,this->digits_ + iVar13,it);
    uVar9 = *(uint *)&(this->specs_).field_0x4;
    if ((uVar9 >> 0x14 & 1) != 0 && 0 < iVar8) {
      local_39[1] = 0x30;
      bVar3.container =
           (buffer<char> *)
           std::__fill_n_a1<fmt::v7::detail::buffer_appender<char>,int,char>
                     ((buffer_appender<char>)bVar3.container,iVar8,local_39 + 1);
      uVar9 = *(uint *)&(this->specs_).field_0x4;
    }
    local_39[2] = ((uVar9 >> 0x10 & 1) == 0) << 5 | 0x45;
    buffer<char>::push_back(bVar3.container,local_39 + 2);
    bVar4 = write_exponent<char,fmt::v7::detail::buffer_appender<char>>
                      (uVar12 - 1,(buffer_appender<char>)bVar3.container);
    return (buffer_appender<char>)
           bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
  }
  if (this->exp_ < 0) {
    if ((int)uVar12 < 1) {
      local_33[1] = 0x30;
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                 local_33 + 1);
      iVar13 = -uVar12;
      uVar9 = this->num_digits_;
      if (uVar9 == 0) {
        iVar8 = (this->specs_).precision;
        iVar2 = iVar13;
        if (SBORROW4(iVar8,iVar13) != (int)(iVar8 + uVar12) < 0) {
          iVar2 = iVar8;
        }
        if (-1 < iVar8) {
          iVar13 = iVar2;
        }
      }
      uVar12 = *(uint *)&(this->specs_).field_0x4 & 0x100000;
      if (0 < (int)uVar9 && (char)(uVar12 >> 0x14) == '\0') {
        do {
          if (this->digits_[(ulong)uVar9 - 1] != '0') goto LAB_0020d2bd;
          bVar1 = 1 < (int)uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar1);
        uVar9 = 0;
      }
LAB_0020d2bd:
      if ((uVar12 == 0 && iVar13 == 0) && uVar9 == 0) {
        return (buffer_appender<char>)
               it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
      }
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                 &this->decimal_point_);
      local_33[2] = 0x30;
      _Var5 = std::__fill_n_a1<fmt::v7::detail::buffer_appender<char>,int,char>
                        (it,iVar13,local_33 + 2);
      bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                        (this->digits_,this->digits_ + (int)uVar9,
                         (buffer_appender<char>)
                         _Var5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
      ;
      return (buffer_appender<char>)
             bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    uVar10 = (ulong)uVar12;
    bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                      (this->digits_,this->digits_ + uVar10,it);
    if (((this->specs_).field_0x6 & 0x10) == 0) {
      uVar9 = this->num_digits_;
      lVar7 = (long)(int)uVar9;
      pcVar6 = this->digits_;
      uVar11 = uVar12;
      if ((int)uVar9 < (int)uVar12) {
        uVar11 = uVar9;
      }
      do {
        if (lVar7 <= (long)uVar10) {
LAB_0020d365:
          if (uVar11 != uVar12) {
            buffer<char>::push_back
                      ((buffer<char> *)
                       bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                       &this->decimal_point_);
            pcVar6 = this->digits_;
          }
          bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                  __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                            (pcVar6 + uVar10,pcVar6 + (int)uVar11,bVar4);
          return (buffer_appender<char>)
                 bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
        }
        if (pcVar6[lVar7 + -1] != '0') {
          uVar11 = (uint)lVar7;
          goto LAB_0020d365;
        }
        lVar7 = lVar7 + -1;
      } while( true );
    }
    buffer<char>::push_back
              ((buffer<char> *)
               bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
               &this->decimal_point_);
    bVar3.container =
         (buffer<char> *)
         std::__copy_move<false,false,std::random_access_iterator_tag>::
         __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                   (this->digits_ + uVar10,this->digits_ + this->num_digits_,bVar4);
    iVar13 = (this->specs_).precision;
    iVar8 = iVar13 - this->num_digits_;
    if (iVar8 == 0 || iVar13 < this->num_digits_) {
      return (buffer_appender<char>)bVar3.container;
    }
    pcVar6 = local_33;
  }
  else {
    bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                      (this->digits_,this->digits_ + this->num_digits_,it);
    local_36[0] = '0';
    bVar3.container =
         (buffer<char> *)
         std::__fill_n_a1<fmt::v7::detail::buffer_appender<char>,int,char>
                   (bVar4,uVar12 - this->num_digits_,local_36);
    if ((((this->specs_).field_0x6 & 0x10) == 0) && (-1 < (this->specs_).precision)) {
      return (buffer_appender<char>)bVar3.container;
    }
    buffer<char>::push_back(bVar3.container,&this->decimal_point_);
    iVar13 = (this->specs_).precision;
    iVar8 = iVar13 - uVar12;
    if (iVar8 == 0 || iVar13 < (int)uVar12) {
      if ((this->specs_).field_0x4 == '\x02') {
        return (buffer_appender<char>)bVar3.container;
      }
      local_36[1] = 0x30;
      buffer<char>::push_back(bVar3.container,local_36 + 1);
      return (buffer_appender<char>)bVar3.container;
    }
    pcVar6 = local_36 + 2;
  }
  *pcVar6 = '0';
  _Var5 = std::__fill_n_a1<fmt::v7::detail::buffer_appender<char>,int,char>
                    ((buffer_appender<char>)bVar3.container,iVar8,pcVar6);
  return (buffer_appender<char>)
         _Var5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FMT_FUZZ
        if (num_zeros > 5000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }